

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  ZSTD_Sequence *pZVar1;
  BYTE *pBVar2;
  BYTE **ppBVar3;
  uint uVar4;
  ZSTD_CDict *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  BYTE *pBVar7;
  seqDef *psVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  long lVar15;
  uint uVar16;
  ZSTD_Sequence *pZVar17;
  uint uVar18;
  U32 offCode;
  ulong uVar19;
  repcodes_t updatedRepcodes;
  uint local_88 [4];
  ZSTD_sequencePosition *local_78;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  BYTE *local_58;
  size_t local_50;
  ulong local_48;
  ZSTD_Sequence *local_40;
  BYTE *local_38;
  
  uVar18 = seqPos->idx;
  uVar11 = (ulong)uVar18;
  pZVar5 = cctx->cdict;
  if (pZVar5 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict != (void *)0x0) {
      pZVar5 = (ZSTD_CDict *)&cctx->prefixDict;
      goto LAB_006b502a;
    }
    local_60 = 0;
  }
  else {
LAB_006b502a:
    local_60 = (ulong)(uint)pZVar5->dictContentSize;
  }
  local_58 = (BYTE *)(blockSize + (long)src);
  pZVar6 = (cctx->blockState).prevCBlock;
  local_88[2] = pZVar6->rep[2];
  uVar19 = *(ulong *)pZVar6->rep;
  local_88[0] = (uint)uVar19;
  local_88[1] = (uint)(uVar19 >> 0x20);
  pZVar17 = inSeqs;
  local_78 = seqPos;
  local_50 = inSeqsSize;
  local_48 = uVar11;
  if (uVar11 < inSeqsSize) {
    local_68 = uVar19 & 0xffffffff;
    local_88[3] = local_88[1];
    local_38 = local_58 + -0x20;
    local_6c = local_88[2];
    local_40 = inSeqs;
    do {
      uVar18 = (uint)uVar11;
      pZVar1 = local_40 + uVar11;
      uVar4 = local_40[uVar11].matchLength;
      if (((ulong)uVar4 == 0) && (pZVar17 = local_40, pZVar1->offset == 0)) break;
      uVar16 = pZVar1->litLength;
      uVar11 = (ulong)uVar16;
      if (externalRepSearch == ZSTD_ps_disable) {
        if (pZVar1->offset == 0) {
          __assert_fail("(inSeqs[idx].offset)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1916,
                        "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                       );
        }
        offCode = pZVar1->offset + 3;
        uVar10 = local_88[3];
      }
      else {
        offCode = ZSTD_finalizeOffBase(pZVar1->offset,local_88,(uint)(uVar11 == 0));
        uVar13 = (uint)local_68;
        seqPos = local_78;
        if (offCode < 4) {
          if (offCode == 0) {
            __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
          }
          uVar12 = offCode - (uVar11 != 0);
          uVar10 = local_88[3];
          if (uVar12 == 0) goto LAB_006b5170;
          if (uVar12 == 3) {
            local_88[0] = uVar13 - 1;
          }
          else {
            local_88[0] = local_88[uVar12];
          }
          if (uVar12 == 1) {
            local_88[3] = local_6c;
          }
        }
        else {
          local_88[0] = offCode - 3;
        }
        local_68 = (ulong)local_88[0];
        local_88[1] = uVar13;
        local_88[2] = local_88[3];
        uVar10 = uVar13;
        local_6c = local_88[3];
      }
LAB_006b5170:
      local_88[3] = uVar10;
      if ((cctx->appliedParams).validateSequences != 0) {
        sVar14 = (ulong)(uVar16 + uVar4) + seqPos->posInSrc;
        seqPos->posInSrc = sVar14;
        sVar14 = ZSTD_validateSequence
                           (offCode,uVar4,(cctx->appliedParams).cParams.minMatch,sVar14,
                            (cctx->appliedParams).cParams.windowLog,local_60,
                            (cctx->appliedParams).useSequenceProducer);
        seqPos = local_78;
        if (0xffffffffffffff88 < sVar14) {
          return sVar14;
        }
      }
      uVar19 = (cctx->seqStore).maxNbSeq;
      if (uVar19 <= uVar18 - seqPos->idx) {
        return 0xffffffffffffff95;
      }
      if (uVar19 <= (ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart
                           >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar19 = (cctx->seqStore).maxNbLit;
      if (0x20000 < uVar19) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar7 = (cctx->seqStore).lit;
      if ((cctx->seqStore).litStart + uVar19 < pBVar7 + uVar11) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar2 = (BYTE *)((long)src + uVar11);
      if (local_58 < pBVar2) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_38 < pBVar2) {
        ZSTD_safecopyLiterals(pBVar7,(BYTE *)src,pBVar2,local_38);
        seqPos = local_78;
LAB_006b5249:
        ppBVar3 = &(cctx->seqStore).lit;
        *ppBVar3 = *ppBVar3 + uVar11;
        if (0xffff < uVar16) {
          if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3);
        }
      }
      else {
        uVar9 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar7 = *src;
        *(undefined8 *)(pBVar7 + 8) = uVar9;
        if (0x10 < uVar16) {
          pBVar7 = (cctx->seqStore).lit;
          if ((BYTE *)0xffffffffffffffe0 < pBVar7 + 0x10 + (-0x10 - ((long)src + 0x10))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar9 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar7 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar7 + 0x18) = uVar9;
          if (0x10 < uVar11 - 0x10) {
            lVar15 = 0;
            do {
              uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar15 + 0x20) + 8);
              pBVar2 = pBVar7 + lVar15 + 0x20;
              *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar15 + 0x20);
              *(undefined8 *)(pBVar2 + 8) = uVar9;
              uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar15 + 0x30) + 8);
              *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar15 + 0x30);
              *(undefined8 *)(pBVar2 + 0x18) = uVar9;
              lVar15 = lVar15 + 0x20;
            } while (pBVar2 + 0x20 < pBVar7 + uVar11);
            goto LAB_006b5249;
          }
        }
        ppBVar3 = &(cctx->seqStore).lit;
        *ppBVar3 = *ppBVar3 + uVar11;
      }
      psVar8 = (cctx->seqStore).sequences;
      psVar8->litLength = (U16)uVar16;
      psVar8->offBase = offCode;
      if (uVar4 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar11 = (ulong)uVar4 - 3;
      if (0xffff < uVar11) {
        if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar8 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
      psVar8->mlBase = (U16)uVar11;
      (cctx->seqStore).sequences = psVar8 + 1;
      src = (void *)((long)src + (ulong)(uVar4 + uVar16));
      uVar18 = uVar18 + 1;
      uVar11 = (ulong)uVar18;
      pZVar17 = local_40;
    } while (uVar11 < local_50);
  }
  uVar4 = local_88[1];
  if (externalRepSearch == ZSTD_ps_auto) {
    __assert_fail("externalRepSearch != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x192b,
                  "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  uVar16 = (uint)local_48;
  if (uVar18 < uVar16) {
    __assert_fail("idx >= startIdx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x192c,
                  "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  uVar13 = local_88[0];
  if (uVar18 != uVar16 && externalRepSearch == ZSTD_ps_disable) {
    uVar13 = uVar18 - 1;
    if (uVar13 < uVar16 + 2) {
      if (uVar18 != uVar16 + 2) {
        if (uVar13 != uVar16) {
          __assert_fail("lastSeqIdx == startIdx",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x193a,
                        "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                       );
        }
        local_88[1] = local_88[0];
        local_88[2] = uVar4;
        uVar13 = pZVar17[local_48].offset;
        goto LAB_006b544b;
      }
    }
    else {
      local_88[0] = pZVar17[uVar18 - 3].offset;
    }
    local_88[1] = pZVar17[uVar18 - 2].offset;
    uVar13 = pZVar17[uVar13].offset;
    local_88[2] = local_88[0];
  }
LAB_006b544b:
  local_88[0] = uVar13;
  pZVar6 = (cctx->blockState).nextCBlock;
  pZVar6->rep[2] = local_88[2];
  *(ulong *)pZVar6->rep = CONCAT44(local_88[1],local_88[0]);
  uVar19 = (ulong)pZVar17[uVar11].litLength;
  if (uVar19 != 0) {
    memcpy((cctx->seqStore).lit,src,uVar19);
    ppBVar3 = &(cctx->seqStore).lit;
    *ppBVar3 = *ppBVar3 + uVar19;
    src = (void *)((long)src + (ulong)pZVar17[uVar11].litLength);
    local_78->posInSrc = local_78->posInSrc + (ulong)pZVar17[uVar11].litLength;
    seqPos = local_78;
  }
  sVar14 = 0xffffffffffffff95;
  if ((BYTE *)src == local_58) {
    seqPos->idx = uVar18 + 1;
    sVar14 = 0;
  }
  return sVar14;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}